

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O3

void __thiscall
prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
          (prevector<28u,unsigned_char,unsigned_int,int> *this,uchar *args)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  prevector<28u,unsigned_char,unsigned_int,int> *ppVar5;
  uint uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(uint *)(this + 0x1c);
  uVar4 = uVar3 - 0x1d;
  uVar1 = *(uint *)(this + 8);
  uVar6 = uVar4;
  if (uVar3 < 0x1d) {
    uVar6 = uVar3;
    uVar1 = 0x1c;
  }
  uVar6 = uVar6 + 1;
  if (uVar1 < uVar6) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,(uVar6 >> 1) + uVar6);
    uVar3 = *(uint *)(this + 0x1c);
    uVar4 = uVar3 - 0x1d;
  }
  if (uVar3 < 0x1d) {
    uVar4 = uVar3;
  }
  ppVar5 = *(prevector<28u,unsigned_char,unsigned_int,int> **)this;
  if (uVar3 < 0x1d) {
    ppVar5 = this;
  }
  ppVar5[(int)uVar4] = (prevector<28u,unsigned_char,unsigned_int,int>)*args;
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace_back(Args&&... args) {
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        new(item_ptr(size())) T(std::forward<Args>(args)...);
        _size++;
    }